

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O2

void __thiscall Restaurant::goOpen(Restaurant *this,string *details)

{
  bool bVar1;
  int ind;
  long lVar2;
  Table *pTVar3;
  reference ppTVar4;
  Customer *pCVar5;
  OpenTable *this_00;
  string token1;
  vector<Customer_*,_std::allocator<Customer_*>_> customers;
  string token2;
  string delimiterSpace;
  string delimiterComa;
  Customer *newCustomer;
  string local_70;
  string local_50;
  
  std::__cxx11::string::_M_assign((string *)&this->newMsg);
  customers.super__Vector_base<Customer_*,_std::allocator<Customer_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  customers.super__Vector_base<Customer_*,_std::allocator<Customer_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  customers.super__Vector_base<Customer_*,_std::allocator<Customer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&delimiterSpace," ",(allocator *)&delimiterComa);
  std::__cxx11::string::string((string *)&delimiterComa,",",(allocator *)&token1);
  token1._M_dataplus._M_p = (pointer)&token1.field_2;
  token1._M_string_length = 0;
  token1.field_2._M_local_buf[0] = '\0';
  token2._M_dataplus._M_p = (pointer)&token2.field_2;
  token2._M_string_length = 0;
  token2.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::find((string *)details,(ulong)&delimiterSpace);
  std::__cxx11::string::substr((ulong)&newCustomer,(ulong)details);
  std::__cxx11::string::operator=((string *)&token1,(string *)&newCustomer);
  std::__cxx11::string::~string((string *)&newCustomer);
  ind = std::__cxx11::stoi(&token1,(size_t *)0x0,10);
  std::__cxx11::string::erase((ulong)details,0);
  while( true ) {
    lVar2 = std::__cxx11::string::find((string *)details,(ulong)&delimiterSpace);
    if (lVar2 == -1) break;
    pTVar3 = getTable(this,ind);
    if (pTVar3 == (Table *)0x0) break;
    std::__cxx11::string::find((string *)details,(ulong)&delimiterComa);
    std::__cxx11::string::substr((ulong)&newCustomer,(ulong)details);
    std::__cxx11::string::operator=((string *)&token1,(string *)&newCustomer);
    std::__cxx11::string::~string((string *)&newCustomer);
    std::__cxx11::string::erase((ulong)details,0);
    std::__cxx11::string::find((string *)details,(ulong)&delimiterSpace);
    std::__cxx11::string::substr((ulong)&newCustomer,(ulong)details);
    std::__cxx11::string::operator=((string *)&token2,(string *)&newCustomer);
    std::__cxx11::string::~string((string *)&newCustomer);
    std::__cxx11::string::erase((ulong)details,0);
    if ((token1._M_string_length != 0) && (token2._M_string_length != 0)) {
      ppTVar4 = std::vector<Table_*,_std::allocator<Table_*>_>::at(&this->tables,(long)ind);
      bVar1 = Table::isOpen(*ppTVar4);
      if (!bVar1) {
        std::__cxx11::string::string((string *)&local_70,(string *)&token1);
        std::__cxx11::string::string((string *)&local_50,(string *)&token2);
        pCVar5 = createCustomerByType(this,&local_70,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        newCustomer = pCVar5;
        std::vector<Customer_*,_std::allocator<Customer_*>_>::push_back
                  (&customers,(value_type *)&newCustomer);
        this->nextCustomerId = this->nextCustomerId + 1;
        std::__cxx11::string::assign((char *)&token1);
        std::__cxx11::string::assign((char *)&token2);
      }
    }
  }
  this_00 = (OpenTable *)operator_new(0x68);
  OpenTable::OpenTable(this_00,(long)ind,&customers);
  (**(this_00->super_BaseAction)._vptr_BaseAction)(this_00,this);
  newCustomer = (Customer *)this_00;
  std::vector<BaseAction*,std::allocator<BaseAction*>>::emplace_back<BaseAction*>
            ((vector<BaseAction*,std::allocator<BaseAction*>> *)&this->actionsLog,
             (BaseAction **)&newCustomer);
  std::__cxx11::string::~string((string *)&token2);
  std::__cxx11::string::~string((string *)&token1);
  std::__cxx11::string::~string((string *)&delimiterComa);
  std::__cxx11::string::~string((string *)&delimiterSpace);
  std::_Vector_base<Customer_*,_std::allocator<Customer_*>_>::~_Vector_base
            (&customers.super__Vector_base<Customer_*,_std::allocator<Customer_*>_>);
  return;
}

Assistant:

void Restaurant::goOpen(std::string details)
{
    newMsg = details;
    std::vector<Customer*> customers;
    int tableId;
    std::string delimiterSpace = " ";
    std::string delimiterComa = ",";
    size_t pos1 = 0;
    std::string token1;
    std::string token2;
    pos1 = details.find(delimiterSpace);
    token1 = details.substr(0,pos1);
    tableId = std::stoi(token1);//get the id
    details.erase(0, pos1 + delimiterSpace.length());

    //get the customers
    size_t pos2 = 0;
    while((pos2 = details.find(delimiterSpace)) != std::string::npos && getTable(tableId) != nullptr)
    {
        pos2 = details.find(delimiterComa);
        token1 = details.substr(0, pos2);
        details.erase(0, pos2 + delimiterComa.length());
        pos2 = details.find(delimiterSpace);
        token2 = details.substr(0, pos2);
        details.erase(0, pos2 + delimiterSpace.length());
        if(!token1.empty() && !token2.empty() && !tables.at(static_cast<unsigned long>(tableId))->isOpen())
        {
            Customer *newCustomer = createCustomerByType(token1, token2);
            customers.push_back(newCustomer);
            nextCustomerId++;
            token1="";
            token2="";
        }
    }
    auto open = new OpenTable(static_cast<unsigned long>(tableId), customers);
    open->act(*this);
    actionsLog.push_back(open);
}